

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O2

void __thiscall AutoSystemInfo::Initialize(AutoSystemInfo *this)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  HANDLE pVVar5;
  AutoSystemInfo *this_00;
  WCHAR local_228 [4];
  WCHAR DisableDebugScopeCaptureFlag [260];
  
  if (this->initialized == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x42,"(!initialized)","!initialized");
    if (!bVar2) goto LAB_0035c575;
    *puVar4 = 0;
  }
  PAL_InitializeChakraCore();
  this->majorVersion = 1;
  this->minorVersion = 0xd;
  pVVar5 = GetCurrentProcess();
  this->processHandle = pVVar5;
  GetSystemInfo(&this->super_SYSTEM_INFO);
  if ((this->super_SYSTEM_INFO).dwPageSize != 0x1000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x4d,"(this->dwPageSize == AutoSystemInfo::PageSize)",
                       "this->dwPageSize == AutoSystemInfo::PageSize");
    if (!bVar2) {
LAB_0035c575:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = (AutoSystemInfo *)this->CPUInfo;
  get_cpuid((int *)this_00,1);
  bVar2 = CheckForAtom(this_00);
  this->isAtom = bVar2;
  this->allocationGranularityPageCount =
       (this->super_SYSTEM_INFO).dwAllocationGranularity / (this->super_SYSTEM_INFO).dwPageSize;
  this->isWindows8OrGreater = false;
  this->isWindows8Point1OrGreater = false;
  this->binaryName[0] = L'\0';
  InitPhysicalProcessorCount(this);
  this->initialized = true;
  DVar3 = GetEnvironmentVariableW(L"JS_DEBUG_SCOPE",local_228,0x104);
  this->disableDebugScopeCapture = DVar3 != 0;
  this->availableCommit = 0;
  *(undefined4 *)((long)&this->availableCommit + 7) = 0;
  ChakraBinaryAutoSystemInfoInit(this);
  return;
}

Assistant:

void
AutoSystemInfo::Initialize()
{
    Assert(!initialized);
#ifndef _WIN32
    PAL_InitializeChakraCore();
    majorVersion = CHAKRA_CORE_MAJOR_VERSION;
    minorVersion = CHAKRA_CORE_MINOR_VERSION;
#endif

    processHandle = GetCurrentProcess();
    GetSystemInfo(this);

    // Make the page size constant so calculation are faster.
    Assert(this->dwPageSize == AutoSystemInfo::PageSize);
#if defined(_M_IX86) || defined(_M_X64)
    get_cpuid(CPUInfo, 1);
    isAtom = CheckForAtom();
#endif
#if defined(_M_ARM32_OR_ARM64)
    armDivAvailable = IsProcessorFeaturePresent(PF_ARM_DIVIDE_INSTRUCTION_AVAILABLE) ? true : false;
#endif
    allocationGranularityPageCount = dwAllocationGranularity / dwPageSize;

    isWindows8OrGreater = IsWindows8OrGreater();
    isWindows8Point1OrGreater = IsWindows8Point1OrGreater();

    binaryName[0] = _u('\0');

#if SYSINFO_IMAGE_BASE_AVAILABLE
    dllLoadAddress = (UINT_PTR)&__ImageBase;
    dllHighAddress = (UINT_PTR)&__ImageBase +
        ((PIMAGE_NT_HEADERS)(((char *)&__ImageBase) + __ImageBase.e_lfanew))->OptionalHeader.SizeOfImage;
#endif

    InitPhysicalProcessorCount();
#if DBG
    initialized = true;
#endif

    WCHAR DisableDebugScopeCaptureFlag[MAX_PATH];
    if (::GetEnvironmentVariable(_u("JS_DEBUG_SCOPE"), DisableDebugScopeCaptureFlag, _countof(DisableDebugScopeCaptureFlag)) != 0)
    {
        disableDebugScopeCapture = true;
    }
    else
    {
        disableDebugScopeCapture = false;
    }

    this->supportsOnlyMultiThreadedCOM = false;
#if defined(__ANDROID__) || defined(__IOS__)
    this->isLowMemoryDevice = true;
    this->shouldQCMoreFrequently = true;
#else
    this->shouldQCMoreFrequently = false;
    this->isLowMemoryDevice = false;
#endif

    // 0 indicates we haven't retrieved the available commit. We get it lazily.
    this->availableCommit = 0;

    ChakraBinaryAutoSystemInfoInit(this);
}